

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbt_set.cpp
# Opt level: O2

void __thiscall
icu_63::TransliterationRuleSet::TransliterationRuleSet
          (TransliterationRuleSet *this,TransliterationRuleSet *other)

{
  int iVar1;
  UVector *pUVar2;
  UErrorCode UVar3;
  UVector *this_00;
  TransliterationRule *this_01;
  TransliterationRule *other_00;
  int index;
  code *__src;
  UErrorCode status;
  UParseError p;
  
  this->_vptr_TransliterationRuleSet = (_func_int **)&PTR__TransliterationRuleSet_0045bd50;
  this->ruleVector = (UVector *)0x0;
  this->rules = (TransliterationRule **)0x0;
  this->maxContextLength = other->maxContextLength;
  __src = (code *)other->index;
  memcpy(this->index,__src,0x404);
  status = U_ZERO_ERROR;
  this_00 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)__src);
  if (this_00 == (UVector *)0x0) {
    UVar3 = U_ZERO_ERROR;
  }
  else {
    __src = _deleteRule;
    UVector::UVector(this_00,_deleteRule,(UElementsAreEqual *)0x0,&status);
    UVar3 = status;
  }
  this->ruleVector = this_00;
  pUVar2 = other->ruleVector;
  this_01 = (TransliterationRule *)CONCAT71((int7)((ulong)__src >> 8),pUVar2 == (UVector *)0x0);
  if ((UVar3 < U_ILLEGAL_ARGUMENT_ERROR && this_00 != (UVector *)0x0) && pUVar2 != (UVector *)0x0) {
    iVar1 = pUVar2->count;
    index = 0;
    do {
      if (iVar1 <= index) break;
      this_01 = (TransliterationRule *)UMemory::operator_new((UMemory *)0x88,(size_t)this_01);
      if (this_01 == (TransliterationRule *)0x0) {
        status = U_MEMORY_ALLOCATION_ERROR;
        UVar3 = U_MEMORY_ALLOCATION_ERROR;
        break;
      }
      other_00 = (TransliterationRule *)UVector::elementAt(other->ruleVector,index);
      TransliterationRule::TransliterationRule(this_01,other_00);
      UVector::addElement(this->ruleVector,this_01,&status);
      index = index + 1;
      UVar3 = status;
    } while (status < U_ILLEGAL_ARGUMENT_ERROR);
  }
  if (UVar3 < U_ILLEGAL_ARGUMENT_ERROR && other->rules != (TransliterationRule **)0x0) {
    (*this->_vptr_TransliterationRuleSet[4])(this,&p,&status);
  }
  return;
}

Assistant:

TransliterationRuleSet::TransliterationRuleSet(const TransliterationRuleSet& other) :
    UMemory(other),
    ruleVector(0),
    rules(0),
    maxContextLength(other.maxContextLength) {

    int32_t i, len;
    uprv_memcpy(index, other.index, sizeof(index));
    UErrorCode status = U_ZERO_ERROR;
    ruleVector = new UVector(&_deleteRule, NULL, status);
    if (other.ruleVector != 0 && ruleVector != 0 && U_SUCCESS(status)) {
        len = other.ruleVector->size();
        for (i=0; i<len && U_SUCCESS(status); ++i) {
            TransliterationRule *tempTranslitRule = new TransliterationRule(*(TransliterationRule*)other.ruleVector->elementAt(i));
            // Null pointer test
            if (tempTranslitRule == NULL) {
                status = U_MEMORY_ALLOCATION_ERROR;
                break;
            }
            ruleVector->addElement(tempTranslitRule, status);
            if (U_FAILURE(status)) {
                break;
            }
        }
    }
    if (other.rules != 0 && U_SUCCESS(status)) {
        UParseError p;
        freeze(p, status);
    }
}